

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O2

char * xcrypt(char *str,char *buf)

{
  byte bVar1;
  char *q;
  long lVar2;
  char *p;
  int iVar3;
  byte bVar4;
  
  iVar3 = 1;
  for (lVar2 = 0; bVar1 = str[lVar2], bVar1 != 0; lVar2 = lVar2 + 1) {
    bVar4 = (byte)iVar3;
    if ((bVar1 & 0x60) == 0) {
      bVar4 = 0;
    }
    buf[lVar2] = bVar4 ^ bVar1;
    iVar3 = iVar3 * 2;
    if (0x1f < iVar3) {
      iVar3 = 1;
    }
  }
  buf[lVar2] = '\0';
  return buf;
}

Assistant:

char *xcrypt(const char *str, char *buf) /* trivial text encryption routine (see makedefs) */
{
    const char *p;
    char *q;
    int bitmask;

    for (bitmask = 1, p = str, q = buf; *p; q++) {
	*q = *p++;
	if (*q & (32|64)) *q ^= bitmask;
	if ((bitmask <<= 1) >= 32) bitmask = 1;
    }
    *q = '\0';
    return buf;
}